

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double fade;
  
  iVar1 = rand();
  dVar2 = (double)((int)((long)iVar1 * 0x40000001 >> 0x3d) - (iVar1 >> 0x1f));
  iVar1 = rand();
  dVar3 = (double)((int)((long)iVar1 * 0x40000001 >> 0x3d) - (iVar1 >> 0x1f));
  return (int)((1.0 - dVar2) * dVar3 + (dVar3 + dVar3) * dVar2);
}

Assistant:

int main()
{
  using namespace chains;

  const auto chain =
    serial(split(module<Gain>(Value<gain::Gain>(1)), module<Gain>(Value<gain::Gain>(2))),
           module<Crossfade, Expose<crossfade::Fade>>(Value<crossfade::Fade>(0.5)));

  auto processor = chain.makeProcessor<double>(44100);
  auto fade = boost::hana::at_c<0>(processor.exposedInputs());

  fade->setValue(rand() / RAND_MAX);

  return processor.tick(rand() / RAND_MAX);
}